

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<TPZFlopCounter>::Identity(TPZMatrix<TPZFlopCounter> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  int64_t iVar5;
  TPZBaseMatrix *in_RDI;
  int64_t col;
  int64_t row;
  char *in_stack_00000188;
  char *in_stack_00000190;
  double local_38;
  TPZFlopCounter local_30;
  double local_28;
  TPZFlopCounter local_20;
  long local_18;
  long local_10;
  
  iVar4 = TPZBaseMatrix::Cols(in_RDI);
  iVar5 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar4 != iVar5) {
    Error(in_stack_00000190,in_stack_00000188);
  }
  local_10 = 0;
  while( true ) {
    lVar1 = local_10;
    iVar4 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar4 <= lVar1) break;
    local_18 = 0;
    while( true ) {
      lVar1 = local_18;
      iVar4 = TPZBaseMatrix::Cols(in_RDI);
      lVar3 = local_10;
      lVar2 = local_18;
      if (iVar4 <= lVar1) break;
      if (local_10 == local_18) {
        local_28 = 1.0;
        TPZFlopCounter::TPZFlopCounter(&local_20,&local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar3,lVar2,&local_20);
      }
      else {
        local_38 = 0.0;
        TPZFlopCounter::TPZFlopCounter(&local_30,&local_38);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar3,lVar2,&local_30);
      }
      local_18 = local_18 + 1;
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Identity() {
	
    if ( Cols() != Rows() ) {
        Error( "identity (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,1.):PutVal(row,col,0.);
        }
    }
}